

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O3

void dgrminer::printResultsToFiles
               (results_crate *results,results_crate_anomalies *results_anomalies,PartialUnion *pu,
               string *output_file,bool set_of_graphs,bool compute_confidence,
               bool search_for_anomalies,bool append_to_file)

{
  pointer pcVar1;
  pointer paVar2;
  pointer paVar3;
  pointer puVar4;
  char cVar5;
  pointer pdVar6;
  pointer piVar7;
  ulong uVar8;
  pointer pvVar9;
  int j;
  long lVar10;
  ulong uVar11;
  results_crate_anomalies *prVar12;
  _Ios_Openmode _Var13;
  char *pcVar14;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  long lVar15;
  string *psVar16;
  ulong uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream myfile;
  undefined1 *local_498 [2];
  undefined1 local_488 [16];
  results_crate_anomalies *local_478;
  string *local_470;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_468;
  undefined4 local_45c;
  PartialUnion *local_458;
  string local_450;
  undefined1 *local_430;
  filebuf local_428 [8];
  undefined1 local_420 [232];
  ios_base local_338 [264];
  undefined1 *local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_45c = CONCAT31(in_register_00000081,set_of_graphs);
  local_468 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)CONCAT44(local_468._4_4_,CONCAT31(in_register_00000089,compute_confidence));
  local_478 = results_anomalies;
  std::ofstream::ofstream((ostream *)&local_230);
  local_470 = output_file;
  local_458 = pu;
  local_430 = local_420;
  if (append_to_file) {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
  }
  else {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"pattern,id,label_int,changetime",0x1f);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
  }
  if ((results->result_nodes).
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (results->result_nodes).
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar15 = 0;
    uVar17 = 0;
    do {
      lVar10 = 0;
      while( true ) {
        std::ostream::operator<<
                  ((ostream *)&local_230,
                   *(int *)((long)((results->result_nodes).
                                   super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                           lVar10 * 4 + lVar15));
        if (lVar10 == 3) break;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
        lVar10 = lVar10 + 1;
      }
      cVar5 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      uVar17 = uVar17 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar17 < (ulong)((long)(results->result_nodes).
                                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(results->result_nodes).
                                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::ofstream::close();
  local_430 = local_420;
  if (append_to_file) {
    pcVar1 = (local_470->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + local_470->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
  }
  else {
    pcVar1 = (local_470->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + local_470->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"pattern,src,dst,label_int,direction,edgetime",0x2c);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
  }
  if ((results->result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (results->result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar15 = 0;
    uVar17 = 0;
    do {
      lVar10 = 0;
      while( true ) {
        std::ostream::operator<<
                  ((ostream *)&local_230,
                   *(int *)((long)((results->result_edges).
                                   super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                           lVar10 * 4 + lVar15));
        if (lVar10 == 5) break;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
        lVar10 = lVar10 + 1;
      }
      cVar5 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      uVar17 = uVar17 + 1;
      lVar15 = lVar15 + 0x18;
    } while (uVar17 < (ulong)(((long)(results->result_edges).
                                     super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(results->result_edges).
                                     super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  std::ofstream::close();
  local_430 = local_420;
  if (append_to_file) {
    pcVar1 = (local_470->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + local_470->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
  }
  else {
    pcVar1 = (local_470->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + local_470->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"support_absolute,support_relative",0x21);
    if ((char)local_468 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",confidence",0xb);
    }
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
  }
  if ((results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar17 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
      std::ostream::_M_insert<double>
                ((results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17]);
      if ((char)local_468 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
        std::ostream::_M_insert<double>
                  ((results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar17]);
      }
      cVar5 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)(results->support_absolute).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(results->support_absolute).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ofstream::close();
  if (append_to_file) {
    pcVar1 = (local_470->_M_dataplus)._M_p;
    local_430 = local_420;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + local_470->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
  }
  else {
    pcVar1 = (local_470->_M_dataplus)._M_p;
    local_430 = local_420;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + local_470->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
    pcVar14 = "graph_snapshots";
    if ((byte)local_45c != 0) {
      pcVar14 = "graphs";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,pcVar14,(ulong)(byte)((byte)local_45c ^ 1) * 9 + 6);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
  }
  local_468 = &results->occurrences;
  pvVar9 = (results->occurrences).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((results->occurrences).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar9) {
    uVar17 = 0;
    do {
      piVar7 = pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar7) {
        uVar11 = 0;
        do {
          std::ostream::operator<<((ostream *)&local_230,piVar7[uVar11] + 1);
          pvVar9 = (local_468->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar7 = pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (long)*(pointer *)
                         ((long)&pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data + 8) - (long)piVar7 >> 2;
          if (uVar11 < uVar8 - 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
            pvVar9 = (local_468->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            piVar7 = pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = (long)*(pointer *)
                           ((long)&pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 8) - (long)piVar7 >> 2;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < uVar8);
      }
      cVar5 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      uVar17 = uVar17 + 1;
      pvVar9 = (results->occurrences).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)(((long)(results->occurrences).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 3)
                             * -0x5555555555555555));
  }
  std::ofstream::close();
  psVar16 = local_470;
  prVar12 = local_478;
  if (search_for_anomalies) {
    std::ofstream::ofstream((ostream *)&local_430);
    local_498[0] = local_488;
    _Var13 = (_Ios_Openmode)local_498;
    if (append_to_file) {
      pcVar1 = (psVar16->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + psVar16->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
    }
    else {
      pcVar1 = (psVar16->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + psVar16->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_430,"anomaly_pattern,id,label_int,changetime",0x27);
      std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    if ((prVar12->anomaly_result_nodes).
        super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (prVar12->anomaly_result_nodes).
        super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar15 = 0;
      uVar17 = 0;
      do {
        lVar10 = 0;
        while( true ) {
          std::ostream::operator<<
                    ((ostream *)&local_430,
                     *(int *)((long)((local_478->anomaly_result_nodes).
                                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                             lVar10 * 4 + lVar15));
          if (lVar10 == 3) break;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,",",1);
          lVar10 = lVar10 + 1;
        }
        cVar5 = (char)(ostream *)&local_430;
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        uVar17 = uVar17 + 1;
        lVar15 = lVar15 + 0x10;
      } while (uVar17 < (ulong)((long)(local_478->anomaly_result_nodes).
                                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_478->anomaly_result_nodes).
                                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::ofstream::close();
    prVar12 = local_478;
    local_498[0] = local_488;
    if (append_to_file) {
      pcVar1 = (local_470->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + local_470->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
    }
    else {
      pcVar1 = (local_470->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + local_470->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_430,"anomaly_pattern,src,dst,label_int,direction,edgetime",0x34);
      std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    if ((prVar12->anomaly_result_edges).
        super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (prVar12->anomaly_result_edges).
        super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar15 = 0;
      uVar17 = 0;
      do {
        lVar10 = 0;
        while( true ) {
          std::ostream::operator<<
                    ((ostream *)&local_430,
                     *(int *)((long)((local_478->anomaly_result_edges).
                                     super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                             lVar10 * 4 + lVar15));
          if (lVar10 == 5) break;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,",",1);
          lVar10 = lVar10 + 1;
        }
        cVar5 = (char)(ostream *)&local_430;
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        uVar17 = uVar17 + 1;
        lVar15 = lVar15 + 0x18;
      } while (uVar17 < (ulong)(((long)(local_478->anomaly_result_edges).
                                       super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_478->anomaly_result_edges).
                                       super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    std::ofstream::close();
    psVar16 = local_470;
    prVar12 = local_478;
    local_498[0] = local_488;
    if (append_to_file) {
      pcVar1 = (local_470->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + local_470->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
    }
    else {
      pcVar1 = (local_470->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + local_470->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_430,"anomaly_pattern,pattern",0x17);
      std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    piVar7 = (prVar12->anomaly_id_of_anomalous_pattern).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((prVar12->anomaly_id_of_anomalous_pattern).super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish != piVar7) {
      uVar17 = 0;
      do {
        std::ostream::operator<<((ostream *)&local_430,piVar7[uVar17]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,",",1);
        std::ostream::operator<<
                  ((ostream *)&local_430,
                   (prVar12->anomaly_id_of_explanation_pattern).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar17]);
        cVar5 = (char)(ostream *)&local_430;
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        uVar17 = uVar17 + 1;
        piVar7 = (prVar12->anomaly_id_of_anomalous_pattern).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
      } while (uVar17 < (ulong)((long)(prVar12->anomaly_id_of_anomalous_pattern).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar7 >> 2));
    }
    std::ofstream::close();
    local_498[0] = local_488;
    if (append_to_file) {
      pcVar1 = (psVar16->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + psVar16->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
    }
    else {
      pcVar1 = (psVar16->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + psVar16->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"outlierness",0xb);
      std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    pdVar6 = (prVar12->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((prVar12->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar6) {
      uVar17 = 0;
      do {
        std::ostream::_M_insert<double>(pdVar6[uVar17]);
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + (char)&local_430);
        std::ostream::put((char)&local_430);
        std::ostream::flush();
        uVar17 = uVar17 + 1;
        pdVar6 = (prVar12->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar17 < (ulong)((long)(prVar12->anomaly_outlierness).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar6 >> 3));
    }
    std::ofstream::close();
    local_498[0] = local_488;
    if (append_to_file) {
      pcVar1 = (psVar16->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + psVar16->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
    }
    else {
      pcVar1 = (psVar16->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_498,pcVar1,pcVar1 + psVar16->_M_string_length);
      std::__cxx11::string::append((char *)local_498);
      std::ofstream::open((string *)&local_430,_Var13);
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
      pcVar14 = "graph_snapshots";
      if ((byte)local_45c != 0) {
        pcVar14 = "graphs";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_430,pcVar14,(ulong)(byte)((byte)local_45c ^ 1) * 9 + 6);
      std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    pvVar9 = (prVar12->anomaly_occurrences).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((prVar12->anomaly_occurrences).
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar9) {
      uVar17 = 0;
      do {
        piVar7 = pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar7) {
          uVar11 = 0;
          do {
            std::ostream::operator<<((ostream *)&local_430,piVar7[uVar11] + 1);
            pvVar9 = (local_478->anomaly_occurrences).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar7 = pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = (long)*(pointer *)
                           ((long)&pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 8) - (long)piVar7 >> 2;
            if (uVar11 < uVar8 - 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,",",1);
              pvVar9 = (local_478->anomaly_occurrences).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar7 = pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar8 = (long)*(pointer *)
                             ((long)&pvVar9[uVar17].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data + 8) - (long)piVar7 >> 2;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar8);
        }
        cVar5 = (char)(ostream *)&local_430;
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        uVar17 = uVar17 + 1;
        pvVar9 = (local_478->anomaly_occurrences).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        prVar12 = local_478;
      } while (uVar17 < (ulong)(((long)(local_478->anomaly_occurrences).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >>
                                3) * -0x5555555555555555));
    }
    std::ofstream::close();
    psVar16 = local_470;
    local_430 = _VTT;
    *(undefined8 *)(local_428 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_428);
    std::ios_base::~ios_base(local_338);
  }
  if (!append_to_file) {
    pcVar1 = (psVar16->_M_dataplus)._M_p;
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_450,pcVar1,pcVar1 + psVar16->_M_string_length);
    std::__cxx11::string::append((char *)&local_450);
    PartialUnion::outputEncodingToFile(local_458,&local_450);
    prVar12 = local_478;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
  }
  paVar2 = (results->result_nodes).
           super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->result_nodes).
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar2) {
    (results->result_nodes).
    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar2;
  }
  paVar3 = (results->result_edges).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar3) {
    (results->result_edges).
    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar3;
  }
  puVar4 = (results->support_absolute).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar4) {
    (results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  pdVar6 = (results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar6) {
    (results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar6;
  }
  pdVar6 = (results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar6) {
    (results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar6;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(local_468);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&results->occurrences_antecedent);
  if (search_for_anomalies) {
    paVar2 = (prVar12->anomaly_result_nodes).
             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((prVar12->anomaly_result_nodes).
        super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish != paVar2) {
      (prVar12->anomaly_result_nodes).
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = paVar2;
    }
    paVar3 = (prVar12->anomaly_result_edges).
             super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((prVar12->anomaly_result_edges).
        super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish != paVar3) {
      (prVar12->anomaly_result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = paVar3;
    }
    piVar7 = (prVar12->anomaly_id_of_anomalous_pattern).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((prVar12->anomaly_id_of_anomalous_pattern).super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish != piVar7) {
      (prVar12->anomaly_id_of_anomalous_pattern).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish = piVar7;
    }
    piVar7 = (prVar12->anomaly_id_of_explanation_pattern).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((prVar12->anomaly_id_of_explanation_pattern).super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish != piVar7) {
      (prVar12->anomaly_id_of_explanation_pattern).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish = piVar7;
    }
    pdVar6 = (prVar12->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((prVar12->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar6) {
      (prVar12->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar6;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear(&prVar12->anomaly_occurrences);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void printResultsToFiles(results_crate * results, results_crate_anomalies * results_anomalies, PartialUnion pu, std::string output_file, bool set_of_graphs,
		bool compute_confidence, bool search_for_anomalies, bool append_to_file)
	{
		// NODES
		ofstream myfile;
		if (append_to_file) {
			myfile.open(output_file + "_nodes", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_nodes");
			myfile << "pattern,id,label_int,changetime" << endl;
		}
		for (size_t i = 0; i < results->result_nodes.size(); i++)
		{
			for (int j = 0; j < 4; j++)
			{
				myfile << results->result_nodes[i][j];
				if (j < 3) {
					myfile << ",";
				}
			}
			myfile << endl;
		}
		myfile.close();

		// EDGES
		if (append_to_file) {
			myfile.open(output_file + "_edges", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_edges");
			myfile << "pattern,src,dst,label_int,direction,edgetime" << endl;
		}
		for (size_t i = 0; i < results->result_edges.size(); i++)
		{
			for (int j = 0; j < 6; j++)
			{
				myfile << results->result_edges[i][j];
				if (j < 5) {
					myfile << ",";
				}
			}
			myfile << endl;
		}
		myfile.close();

		// MEASURES
		if (append_to_file) {
			myfile.open(output_file + "_measures", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_measures");
			myfile << "support_absolute,support_relative";
			if (compute_confidence)
			{
				myfile << ",confidence";
			}
			myfile << endl;
		}
		for (size_t i = 0; i < results->support_absolute.size(); i++)
		{
			myfile << results->support_absolute[i];
			myfile << "," << results->support[i];
			if (compute_confidence)
			{
				myfile << "," << results->confidence[i];
			}
			myfile << endl;
		}
		myfile.close();

		// index snapshots from 1

		// OCCURRENCES
		if (append_to_file) {
			myfile.open(output_file + "_occurrences", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_occurrences");
			if (set_of_graphs)
			{
				myfile << "graphs" << endl;
			}
			else
			{
				myfile << "graph_snapshots" << endl;
			}
		}
		for (size_t i = 0; i < results->occurrences.size(); i++)
		{

			for (int j = 0; j < results->occurrences[i].size(); j++)
			{
				myfile << (results->occurrences[i][j] + 1);
				if (j < results->occurrences[i].size() - 1) {
					myfile << ",";
				}
			}

			myfile << endl;
		}
		myfile.close();



		// print anomalies:
		if (search_for_anomalies)
		{
			// NODES
			ofstream myfile;
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_nodes", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_nodes");
				myfile << "anomaly_pattern,id,label_int,changetime" << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_result_nodes.size(); i++)
			{
				for (int j = 0; j < 4; j++)
				{
					myfile << results_anomalies->anomaly_result_nodes[i][j];
					if (j < 3) {
						myfile << ",";
					}
				}
				myfile << endl;
			}
			myfile.close();

			// EDGES
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_edges", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_edges");
				myfile << "anomaly_pattern,src,dst,label_int,direction,edgetime" << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_result_edges.size(); i++)
			{
				for (int j = 0; j < 6; j++)
				{
					myfile << results_anomalies->anomaly_result_edges[i][j];
					if (j < 5) {
						myfile << ",";
					}
				}
				myfile << endl;
			}
			myfile.close();

			// LINKING TO FREQUENT PATTERNS
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_explanation", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_explanation");
				myfile << "anomaly_pattern,pattern";
				myfile << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_id_of_anomalous_pattern.size(); i++)
			{
				myfile << results_anomalies->anomaly_id_of_anomalous_pattern[i];
				myfile << "," << results_anomalies->anomaly_id_of_explanation_pattern[i];
				myfile << endl;
			}
			myfile.close();

			// ANOMALY OUTLIERNESS
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_outlierness", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_outlierness");
				myfile << "outlierness";
				myfile << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_outlierness.size(); i++)
			{
				myfile << results_anomalies->anomaly_outlierness[i];
				myfile << endl;
			}
			myfile.close();

			// index snapshots from 1

			// OCCURRENCES
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_occurrences", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_occurrences");
				if (set_of_graphs)
				{
					myfile << "graphs" << endl;
				}
				else
				{
					myfile << "graph_snapshots" << endl;
				}
			}
			for (size_t i = 0; i < results_anomalies->anomaly_occurrences.size(); i++)
			{

				for (int j = 0; j < results_anomalies->anomaly_occurrences[i].size(); j++)
				{
					myfile << (results_anomalies->anomaly_occurrences[i][j] + 1);
					if (j < results_anomalies->anomaly_occurrences[i].size() - 1) {
						myfile << ",";
					}
				}

				myfile << endl;
			}
			myfile.close();
		}

		if (!append_to_file) {
			pu.outputEncodingToFile(output_file + "_encoding");
		}

		results->result_nodes.clear();
		results->result_edges.clear();
		results->support_absolute.clear();
		results->support.clear();
		results->confidence.clear();
		results->occurrences.clear();
		results->occurrences_antecedent.clear();

		if (search_for_anomalies)
		{
			results_anomalies->anomaly_result_nodes.clear();
			results_anomalies->anomaly_result_edges.clear();
			results_anomalies->anomaly_id_of_anomalous_pattern.clear();
			results_anomalies->anomaly_id_of_explanation_pattern.clear();
			results_anomalies->anomaly_outlierness.clear();
			results_anomalies->anomaly_occurrences.clear();
		}
	}